

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_error_strerror.c
# Opt level: O2

char * zip_error_strerror(zip_error_t *err)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  char *__s_00;
  char *pcVar3;
  long lVar4;
  char *__s_01;
  bool bVar5;
  char buf [128];
  char acStack_a8 [136];
  
  __s = acStack_a8;
  zip_error_fini(err);
  lVar4 = (long)err->zip_err;
  if ((lVar4 < 0) || (0x20 < err->zip_err)) {
    __s_01 = (char *)0x0;
    sprintf(acStack_a8,"Unknown error %d");
  }
  else {
    __s_01 = _zip_err_str[lVar4];
    if (_zip_err_type[lVar4] == 2) {
      __s = (char *)zError(err->sys_err);
    }
    else {
      if (_zip_err_type[lVar4] != 1) {
        return __s_01;
      }
      __s = strerror(err->sys_err);
    }
    if (__s == (char *)0x0) {
      return __s_01;
    }
  }
  sVar1 = strlen(__s);
  if (__s_01 == (char *)0x0) {
    lVar4 = 0;
  }
  else {
    sVar2 = strlen(__s_01);
    lVar4 = sVar2 + 2;
  }
  __s_00 = (char *)malloc(sVar1 + lVar4 + 1);
  if (__s_00 == (char *)0x0) {
    __s_00 = "Malloc failure";
  }
  else {
    bVar5 = __s_01 == (char *)0x0;
    if (bVar5) {
      __s_01 = "";
    }
    pcVar3 = ": ";
    if (bVar5) {
      pcVar3 = "";
    }
    sprintf(__s_00,"%s%s%s",__s_01,pcVar3,__s);
    err->str = __s_00;
  }
  return __s_00;
}

Assistant:

ZIP_EXTERN const char *
zip_error_strerror(zip_error_t *err) {
    const char *zs, *ss;
    char buf[128], *s;

    zip_error_fini(err);

    if (err->zip_err < 0 || err->zip_err >= _zip_nerr_str) {
	sprintf(buf, "Unknown error %d", err->zip_err);
	zs = NULL;
	ss = buf;
    }
    else {
	zs = _zip_err_str[err->zip_err];

	switch (_zip_err_type[err->zip_err]) {
	case ZIP_ET_SYS:
	    ss = strerror(err->sys_err);
	    break;

	case ZIP_ET_ZLIB:
	    ss = zError(err->sys_err);
	    break;

	default:
	    ss = NULL;
	}
    }

    if (ss == NULL)
	return zs;
    else {
	if ((s = (char *)malloc(strlen(ss) + (zs ? strlen(zs) + 2 : 0) + 1)) == NULL)
	    return _zip_err_str[ZIP_ER_MEMORY];

	sprintf(s, "%s%s%s", (zs ? zs : ""), (zs ? ": " : ""), ss);
	err->str = s;

	return s;
    }
}